

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O1

Test * DyndepParserTestImplicitInsAndOuts::Create(void)

{
  Test *pTVar1;
  
  pTVar1 = (Test *)operator_new(0x218);
  pTVar1->failed_ = false;
  pTVar1->assertion_failures_ = 0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__DyndepParserTest_001d5fc8;
  State::State((State *)(pTVar1 + 1));
  *(undefined ***)&pTVar1[0x11].failed_ = &PTR__VirtualFileSystem_001d87a0;
  *(undefined4 *)&pTVar1[0x15].failed_ = 0;
  pTVar1[0x16]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x12]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x12].failed_ = false;
  *(undefined3 *)&pTVar1[0x12].field_0x9 = 0;
  pTVar1[0x12].assertion_failures_ = 0;
  pTVar1[0x13]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x13].failed_ = false;
  *(undefined3 *)&pTVar1[0x13].field_0x9 = 0;
  pTVar1[0x13].assertion_failures_ = 0;
  pTVar1[0x14]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x14].failed_ = false;
  *(undefined3 *)&pTVar1[0x14].field_0x9 = 0;
  pTVar1[0x14].assertion_failures_ = 0;
  *(bool **)&pTVar1[0x16].failed_ = &pTVar1[0x15].failed_;
  pTVar1[0x17]._vptr_Test = (_func_int **)&pTVar1[0x15].failed_;
  pTVar1[0x17].failed_ = false;
  *(undefined3 *)&pTVar1[0x17].field_0x9 = 0;
  pTVar1[0x17].assertion_failures_ = 0;
  *(undefined4 *)&pTVar1[0x18].failed_ = 0;
  pTVar1[0x19]._vptr_Test = (_func_int **)0x0;
  *(bool **)&pTVar1[0x19].failed_ = &pTVar1[0x18].failed_;
  pTVar1[0x1a]._vptr_Test = (_func_int **)&pTVar1[0x18].failed_;
  pTVar1[0x1a].failed_ = false;
  *(undefined3 *)&pTVar1[0x1a].field_0x9 = 0;
  pTVar1[0x1a].assertion_failures_ = 0;
  *(undefined4 *)&pTVar1[0x1b].failed_ = 0;
  pTVar1[0x1c]._vptr_Test = (_func_int **)0x0;
  *(bool **)&pTVar1[0x1c].failed_ = &pTVar1[0x1b].failed_;
  pTVar1[0x1d]._vptr_Test = (_func_int **)&pTVar1[0x1b].failed_;
  pTVar1[0x1d].failed_ = false;
  *(undefined3 *)&pTVar1[0x1d].field_0x9 = 0;
  pTVar1[0x1d].assertion_failures_ = 0;
  *(undefined4 *)&pTVar1[0x1e]._vptr_Test = 1;
  *(undefined4 *)&pTVar1[0x1f]._vptr_Test = 0;
  pTVar1[0x1f].failed_ = false;
  *(undefined3 *)&pTVar1[0x1f].field_0x9 = 0;
  pTVar1[0x1f].assertion_failures_ = 0;
  pTVar1[0x20]._vptr_Test = (_func_int **)(pTVar1 + 0x1f);
  *(Test **)&pTVar1[0x20].failed_ = pTVar1 + 0x1f;
  pTVar1[0x21]._vptr_Test = (_func_int **)0x0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__DyndepParserTest_001d5e70;
  g_current_test = pTVar1;
  return pTVar1;
}

Assistant:

TEST_F(DyndepParserTest, ImplicitInsAndOuts) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"ninja_dyndep_version = 1\n"
"build out | impout1 impout2: dyndep | impin1 impin2\n"));

  EXPECT_EQ(1u, dyndep_file_.size());
  DyndepFile::iterator i = dyndep_file_.find(state_.edges_[0]);
  ASSERT_NE(i, dyndep_file_.end());
  EXPECT_EQ(false, i->second.restat_);
  ASSERT_EQ(2u, i->second.implicit_outputs_.size());
  EXPECT_EQ("impout1", i->second.implicit_outputs_[0]->path());
  EXPECT_EQ("impout2", i->second.implicit_outputs_[1]->path());
  ASSERT_EQ(2u, i->second.implicit_inputs_.size());
  EXPECT_EQ("impin1", i->second.implicit_inputs_[0]->path());
  EXPECT_EQ("impin2", i->second.implicit_inputs_[1]->path());
}